

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

int ask_user_int(char *szPrompt,int iDefault)

{
  long lVar1;
  uint in_ESI;
  undefined8 in_RDI;
  char enter [30];
  char local_38 [36];
  uint local_14;
  undefined8 local_10;
  uint local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_38,0,0x1e);
  printf("%s <%d>: ",local_10,(ulong)local_14);
  fgets(local_38,0x1d,_stdin);
  if ((local_38[0] == '\0') || (local_38[0] == '\n')) {
    local_4 = local_14;
  }
  else {
    lVar1 = strtol(local_38,(char **)0x0,10);
    local_4 = (uint)lVar1;
  }
  return local_4;
}

Assistant:

int
ask_user_int (const char* szPrompt, int iDefault)
{
    char    enter[30] = "";
    printf("%s <%d>: ", szPrompt, iDefault);
    fgets(enter, sizeof(enter)-1, stdin);
    if('\0' == enter[0] || '\n' == enter[0])
        return iDefault;
    return strtol(enter, NULL, 10);
}